

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::Mat(Mat *this,double x,double y,double z,double X,double Y,double Z)

{
  double *pdVar1;
  
  pdVar1 = (double *)operator_new__(0x30);
  this->v_ = pdVar1;
  this->n_rows_ = 6;
  this->n_cols_ = 1;
  *pdVar1 = x;
  pdVar1[1] = y;
  pdVar1[2] = z;
  pdVar1[3] = X;
  pdVar1[4] = Y;
  pdVar1[5] = Z;
  return;
}

Assistant:

Mat::Mat (double x, double y, double z,   // 6dim-vector
          double X, double Y, double Z)  
{
	v_= new double [6];
	n_rows_ = 6;
	n_cols_ = 1;
	v_[0] = x;
	v_[1] = y;
	v_[2] = z;
	v_[3] = X;
	v_[4] = Y;
	v_[5] = Z;  
}